

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cxx
# Opt level: O2

int read_quoted(void)

{
  int iVar1;
  int x;
  int iVar2;
  int iVar3;
  bool bVar4;
  
  iVar1 = fgetc((FILE *)fin);
  switch(iVar1) {
  case 0x6e:
    iVar1 = 10;
    break;
  case 0x72:
    iVar1 = 0xd;
    break;
  case 0x74:
    iVar1 = 9;
    break;
  case 0x76:
    iVar1 = 0xb;
    break;
  case 0x78:
    iVar1 = 0;
    iVar3 = 3;
    while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
      x = fgetc((FILE *)fin);
      iVar2 = hexdigit(x);
      if (0xf < iVar2) goto LAB_0019866e;
      iVar1 = iVar1 * 0x10 + iVar2;
    }
    break;
  default:
    if (iVar1 == 10) {
      lineno = lineno + 1;
      return -1;
    }
    if (iVar1 == 0x61) {
      return 7;
    }
    if (iVar1 == 0x62) {
      return 8;
    }
    if (iVar1 == 0x66) {
      return 0xc;
    }
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x73:
  case 0x75:
  case 0x77:
    if (0xfffffff7 < iVar1 - 0x38U) {
      iVar1 = iVar1 + -0x30;
      iVar3 = 2;
      while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
        x = fgetc((FILE *)fin);
        iVar2 = hexdigit(x);
        if (7 < iVar2) {
LAB_0019866e:
          ungetc(x,(FILE *)fin);
          return iVar1;
        }
        iVar1 = iVar2 + iVar1 * 8;
      }
    }
  }
  return iVar1;
}

Assistant:

static int read_quoted() {	// read whatever character is after a \ .
  int c,d,x;
  switch(c = fgetc(fin)) {
  case '\n': lineno++; return -1;
  case 'a' : return('\a');
  case 'b' : return('\b');
  case 'f' : return('\f');
  case 'n' : return('\n');
  case 'r' : return('\r');
  case 't' : return('\t');
  case 'v' : return('\v');
  case 'x' :	/* read hex */
    for (c=x=0; x<3; x++) {
      int ch = fgetc(fin);
      d = hexdigit(ch);
      if (d > 15) {ungetc(ch,fin); break;}
      c = (c<<4)+d;
    }
    break;
  default:		/* read octal */
    if (c<'0' || c>'7') break;
    c -= '0';
    for (x=0; x<2; x++) {
      int ch = fgetc(fin);
      d = hexdigit(ch);
      if (d>7) {ungetc(ch,fin); break;}
      c = (c<<3)+d;
    }
    break;
  }
  return(c);
}